

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundSource.hpp
# Opt level: O3

void __thiscall
Outputs::Speaker::
CompoundSource<GI::AY38910::AY38910<false>,Audio::Toggle,Konami::SCC,Yamaha::OPL::OPLL>::
CompoundSourceHolder<GI::AY38910::AY38910<false>,Audio::Toggle,Konami::SCC,Yamaha::OPL::OPLL>::
apply_samples<(Outputs::Speaker::Action)2,false>
          (CompoundSourceHolder<GI::AY38910::AY38910<false>,Audio::Toggle,Konami::SCC,Yamaha::OPL::OPLL>
           *this,size_t number_of_samples,type *target)

{
  bool bVar1;
  
  CompoundSourceHolder<Audio::Toggle,Konami::SCC,Yamaha::OPL::OPLL>::
  apply_samples<(Outputs::Speaker::Action)2,false>
            ((CompoundSourceHolder<Audio::Toggle,Konami::SCC,Yamaha::OPL::OPLL> *)(this + 8),
             number_of_samples,target);
  bVar1 = GI::AY38910::AY38910SampleSource<false>::is_zero_level
                    (*(AY38910SampleSource<false> **)this);
  if (bVar1) {
    return;
  }
  SampleSource<GI::AY38910::AY38910<false>,_false,_4>::apply_samples<(Outputs::Speaker::Action)1>
            ((SampleSource<GI::AY38910::AY38910<false>,_false,_4> *)(*(long *)this + 0x1150),
             number_of_samples,target);
  return;
}

Assistant:

void apply_samples(std::size_t number_of_samples, typename ::Outputs::Speaker::SampleT<output_stereo>::type *target) {

					// If this is the step at which a mono-to-stereo adaptation happens, apply it.
					if constexpr (output_stereo && !S::is_stereo) {
						// There'll be only one place in the chain that this conversion happens, but it'll
						// happen there often. So avoid continuously reallocating.
						if(conversion_source_.size() < number_of_samples) {
							conversion_source_.resize(number_of_samples);
						}

						// Populate the conversion buffer with this source and all below.
						apply_samples<Action::Store, false>(number_of_samples, conversion_source_.data());

						// Map up and return.
						for(std::size_t c = 0; c < number_of_samples; c++) {
							Outputs::Speaker::apply<action>(target[c], StereoSample(conversion_source_[c]));
						}
					} else {
						constexpr bool is_final_source = sizeof...(R) == 0;

						// Get the rest of the output, if any.
						if constexpr (!is_final_source) {
							next_source_.template apply_samples<action, output_stereo>(number_of_samples, target);
						}

						if(source_.is_zero_level()) {
							// This component is currently outputting silence; therefore don't add anything to the output
							// audio. Zero fill only if this is the final source (as everything above will be additive).
							if constexpr (is_final_source) {
								Outputs::Speaker::fill<action>(target, target + number_of_samples, typename SampleT<output_stereo>::type());
							}
							return;
						}

						// Add in this component's output.
						source_.template apply_samples<is_final_source ? Action::Store : Action::Mix>(number_of_samples, target);
					}
				}